

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiVertexArrayStorageTests::addStorageCases
          (MultiVertexArrayStorageTests *this,Spec *spec,int depth)

{
  int *piVar1;
  Storage storage_;
  pointer pAVar2;
  GLValue min_;
  GLValue max_;
  MultiVertexArrayTest *this_00;
  ulong uVar3;
  MultiVertexArrayStorageTests *pMVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  long lVar6;
  GLValue GVar7;
  GLValue GVar8;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  string desc;
  string name;
  Spec local_58;
  
  if (depth == 0) {
    pAVar2 = (spec->arrays).
             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)((long)(spec->arrays).
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 6;
    pMVar4 = (MultiVertexArrayStorageTests *)(uVar3 & 0xffffffff);
    if ((int)uVar3 < 1) {
      pMVar4 = (MultiVertexArrayStorageTests *)0x0;
    }
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(MultiVertexArrayStorageTests *)0x0;
    do {
      this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&((MultiVertexArrayStorageTests *)paVar5)->super_TestCaseGroup + 0x40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)pMVar4 * 0x40 + 0x40) == this_01) {
        return;
      }
      piVar1 = (int *)((long)&pAVar2->storage + (long)paVar5);
      paVar5 = this_01;
    } while (*piVar1 == 0);
    getTestName_abi_cxx11_(&name,(MultiVertexArrayStorageTests *)this_01,spec);
    getTestName_abi_cxx11_(&desc,(MultiVertexArrayStorageTests *)this_01,spec);
    this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,spec,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
  }
  else {
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
      storage_ = *(Storage *)
                  ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices + lVar6);
      GVar7 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      GVar8 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      max_._4_4_ = uStack_dc;
      max_.type = GVar8.type;
      min_._4_4_ = uStack_cc;
      min_.type = GVar7.type;
      min_.field_1 = GVar7.field_1;
      max_.field_1 = GVar8.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)&name,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,storage_,USAGE_DYNAMIC_DRAW,2,0,
                 0,false,min_,max_);
      deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)&desc,spec);
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   *)&desc.field_2,(ArraySpec *)&name);
      deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_58,(Spec *)&desc);
      addStorageCases(this,&local_58,depth + -1);
      std::
      _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::~_Vector_base(&local_58.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     );
      std::
      _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::~_Vector_base((_Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&desc.field_2);
    }
  }
  return;
}

Assistant:

void MultiVertexArrayStorageTests::addStorageCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		// Skip trivial case, used elsewhere
		bool ok = false;
		for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
		{
			if (spec.arrays[arrayNdx].storage != Array::STORAGE_USER)
			{
				ok = true;
				break;
			}
		}

		if (!ok)
			return;

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	Array::Storage storages[] = {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
														Array::OUTPUTTYPE_VEC2,
														storages[storageNdx],
														Array::USAGE_DYNAMIC_DRAW,
														2,
														0,
														0,
														false,
														GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
														GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addStorageCases(_spec, depth-1);
	}
}